

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O0

RK_S32 mpi_dec_test_cmd_init(MpiDecTestCmd *cmd,int argc,char **argv)

{
  MpiDecTestCmd *pMVar1;
  size_t sVar2;
  uint local_30;
  MPP_RET local_2c;
  RK_U32 i;
  RK_S32 ret;
  MppOpt opts;
  char **argv_local;
  MpiDecTestCmd *pMStack_10;
  int argc_local;
  MpiDecTestCmd *cmd_local;
  
  _i = (MppOpt)0x0;
  local_2c = MPP_NOK;
  opts = argv;
  argv_local._4_4_ = argc;
  pMStack_10 = cmd;
  if ((1 < argc) && (cmd != (MpiDecTestCmd *)0x0)) {
    mpp_opt_init((MppOpt *)&i);
    mpp_opt_setup(_i,pMStack_10);
    for (local_30 = 0; local_30 < dec_opt_cnt; local_30 = local_30 + 1) {
      mpp_opt_add(_i,dec_opts + local_30);
    }
    mpp_opt_add(_i,(MppOptInfo *)0x0);
    local_2c = mpp_opt_parse(_i,argv_local._4_4_,(char **)opts);
    if ((pMStack_10->have_input != 0) &&
       (reader_init(&pMStack_10->reader,pMStack_10->file_input,pMStack_10->type),
       pMVar1 = pMStack_10, pMStack_10->reader != (FileReader)0x0)) {
      sVar2 = reader_size(pMStack_10->reader);
      _mpp_log_l(4,"mpi_dec_utils","input file %s size %ld\n",0,pMVar1,sVar2);
    }
    if (pMStack_10->trace_fps != 0) {
      fps_calc_init(&pMStack_10->fps);
      if ((pMStack_10->fps == (FpsCalc)0x0) &&
         (_mpp_log_l(2,"mpi_dec_utils","Assertion %s failed at %s:%d\n",0,"cmd->fps",
                     "mpi_dec_test_cmd_init",0x2cc), (_mpp_debug & 0x10000000) != 0)) {
        abort();
      }
      fps_calc_set_cb(pMStack_10->fps,show_dec_fps);
    }
  }
  if (_i != (MppOpt)0x0) {
    mpp_opt_deinit(_i);
    _i = (MppOpt)0x0;
  }
  if (local_2c != MPP_OK) {
    mpi_dec_show_help(*opts);
  }
  return local_2c;
}

Assistant:

RK_S32 mpi_dec_test_cmd_init(MpiDecTestCmd* cmd, int argc, char **argv)
{
    MppOpt opts = NULL;
    RK_S32 ret = -1;
    RK_U32 i;

    if ((argc < 2) || (cmd == NULL))
        goto done;

    mpp_opt_init(&opts);
    /* should change node count when option increases */
    mpp_opt_setup(opts, cmd);

    for (i = 0; i < dec_opt_cnt; i++)
        mpp_opt_add(opts, &dec_opts[i]);

    /* mark option end */
    mpp_opt_add(opts, NULL);

    ret = mpp_opt_parse(opts, argc, argv);

    if (cmd->have_input) {
        reader_init(&cmd->reader, cmd->file_input, cmd->type);
        if (cmd->reader)
            mpp_log("input file %s size %ld\n", cmd->file_input, reader_size(cmd->reader));
    }
    if (cmd->trace_fps) {
        fps_calc_init(&cmd->fps);
        mpp_assert(cmd->fps);
        fps_calc_set_cb(cmd->fps, show_dec_fps);
    }

done:
    if (opts) {
        mpp_opt_deinit(opts);
        opts = NULL;
    }

    if (ret)
        mpi_dec_show_help(argv[0]);

    return ret;
}